

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O3

void __thiscall tf::TFProfObserver::dump(TFProfObserver *this,ostream *os)

{
  long lVar1;
  TFProfObserver *pTVar2;
  ulong uVar3;
  ostream *poVar4;
  size_t sVar5;
  pointer pvVar6;
  bool bVar7;
  pointer *ppvVar8;
  ulong uVar9;
  pointer pvVar10;
  long lVar11;
  pointer pvVar12;
  char *__s;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  char local_5b [3];
  TFProfObserver *local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  pvVar6 = (this->_timeline).segments.
           super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar10 = (this->_timeline).segments.
            super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = ((long)pvVar10 - (long)pvVar6 >> 3) * -0x5555555555555555;
  if (pvVar10 == pvVar6) {
    uVar15 = 0;
  }
  else {
    uVar9 = uVar3 + (uVar3 == 0);
    ppvVar8 = &(pvVar6->
               super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    uVar14 = 0;
    do {
      uVar15 = uVar14;
      if (*ppvVar8 != ((_Vector_impl_data *)(ppvVar8 + -1))->_M_start) break;
      uVar14 = uVar14 + 1;
      ppvVar8 = ppvVar8 + 3;
      uVar15 = uVar9;
    } while (uVar9 != uVar14);
  }
  local_58 = this;
  if (uVar15 != uVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"{\"executor\":\"",0xd);
    pTVar2 = local_58;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\"data\":[",10);
    pvVar6 = (pTVar2->_timeline).segments.
             super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar10 = (pTVar2->_timeline).segments.
              super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (uVar15 < (ulong)(((long)pvVar10 - (long)pvVar6 >> 3) * -0x5555555555555555)) {
      bVar7 = false;
      do {
        local_50 = uVar15 * 3;
        pvVar12 = pvVar6[uVar15].
                  super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar6[uVar15].
                     super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                     ._M_impl.super__Vector_impl_data + 8) != pvVar12) {
          uVar3 = 0;
          local_48 = uVar15;
          do {
            local_40 = uVar3 * 3;
            if (pvVar12[uVar3].super__Vector_base<tf::Segment,_std::allocator<tf::Segment>_>._M_impl
                .super__Vector_impl_data._M_start !=
                *(pointer *)
                 ((long)&pvVar12[uVar3].
                         super__Vector_base<tf::Segment,_std::allocator<tf::Segment>_>._M_impl.
                         super__Vector_impl_data + 8)) {
              if (bVar7) {
                local_5b[0] = ',';
                std::__ostream_insert<char,std::char_traits<char>>(os,local_5b,1);
              }
              std::__ostream_insert<char,std::char_traits<char>>(os,"{\"worker\":",10);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,",\"level\":",9);
              local_38 = uVar3;
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,",\"data\":[",9);
              lVar11 = *(long *)((long)&(((local_58->_timeline).segments.
                                          super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                        )._M_impl.super__Vector_impl_data + local_50 * 8);
              lVar13 = *(long *)(lVar11 + local_40 * 8);
              if (*(long *)(lVar11 + 8 + local_40 * 8) != lVar13) {
                lVar11 = 0x30;
                uVar3 = 0;
                do {
                  if (uVar3 != 0) {
                    local_5b[1] = 0x2c;
                    std::__ostream_insert<char,std::char_traits<char>>(os,local_5b + 1,1);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(os,"{\"span\":[",9);
                  poVar4 = std::ostream::_M_insert<long>((long)os);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
                  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"],",2);
                  std::__ostream_insert<char,std::char_traits<char>>(os,"\"name\":\"",8);
                  lVar1 = *(long *)(lVar13 + -0x28 + lVar11);
                  if (lVar1 == 0) {
                    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
                    local_5b[2] = 0x5f;
                    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar4,local_5b + 2,1);
                    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              (os,*(char **)(lVar13 + -0x30 + lVar11),lVar1);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(os,"\",",2);
                  std::__ostream_insert<char,std::char_traits<char>>(os,"\"type\":\"",8);
                  uVar15 = (ulong)*(uint *)(lVar13 + -0x10 + lVar11);
                  __s = "undefined";
                  if (uVar15 < 7) {
                    __s = (&PTR_anon_var_dwarf_3238e_00117d18)[uVar15];
                  }
                  sVar5 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar5);
                  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
                  std::__ostream_insert<char,std::char_traits<char>>(os,"}",1);
                  uVar3 = uVar3 + 1;
                  lVar1 = *(long *)((long)&(((local_58->_timeline).segments.
                                             super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                           )._M_impl.super__Vector_impl_data + local_50 * 8);
                  lVar13 = *(long *)(lVar1 + local_40 * 8);
                  lVar11 = lVar11 + 0x38;
                } while (uVar3 < (ulong)((*(long *)(lVar1 + 8 + local_40 * 8) - lVar13 >> 3) *
                                        0x6db6db6db6db6db7));
              }
              std::__ostream_insert<char,std::char_traits<char>>(os,"]}",2);
              pvVar6 = (local_58->_timeline).segments.
                       super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              bVar7 = true;
              uVar3 = local_38;
              uVar15 = local_48;
            }
            uVar3 = uVar3 + 1;
            pvVar12 = *(pointer *)
                       ((long)&(pvVar6->
                               super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                               )._M_impl.super__Vector_impl_data + local_50 * 8);
          } while (uVar3 < (ulong)((*(long *)((long)&(pvVar6->
                                                  super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                                  )._M_impl.super__Vector_impl_data +
                                             local_50 * 8 + 8) - (long)pvVar12 >> 3) *
                                  -0x5555555555555555));
          pvVar10 = (local_58->_timeline).segments.
                    super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < (ulong)(((long)pvVar10 - (long)pvVar6 >> 3) * -0x5555555555555555));
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"]}\n",3);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"{}\n",3);
  return;
}

Assistant:

inline void TFProfObserver::dump(std::ostream& os) const {

  using namespace std::chrono;

  size_t first;

  for(first = 0; first<_timeline.segments.size(); ++first) {
    if(_timeline.segments[first].size() > 0) { 
      break; 
    }
  }
  
  // not timeline data to dump
  if(first == _timeline.segments.size()) {
    os << "{}\n";
    return;
  }

  os << "{\"executor\":\"" << _timeline.uid << "\",\"data\":[";

  bool comma = false;

  for(size_t w=first; w<_timeline.segments.size(); w++) {
    for(size_t l=0; l<_timeline.segments[w].size(); l++) {

      if(_timeline.segments[w][l].empty()) {
        continue;
      }

      if(comma) {
        os << ',';
      }
      else {
        comma = true;
      }

      os << "{\"worker\":" << w << ",\"level\":" << l << ",\"data\":[";
      for(size_t i=0; i<_timeline.segments[w][l].size(); ++i) {

        const auto& s = _timeline.segments[w][l][i];

        if(i) os << ',';
        
        // span 
        os << "{\"span\":[" 
           << duration_cast<microseconds>(s.beg - _timeline.origin).count() 
           << ","
           << duration_cast<microseconds>(s.end - _timeline.origin).count() 
           << "],";
        
        // name
        os << "\"name\":\""; 
        if(s.name.empty()) {
          os << w << '_' << i;
        }
        else {
          os << s.name;
        }
        os << "\",";
    
        // e.g., category "type": "Condition Task"
        os << "\"type\":\"" << to_string(s.type) << "\"";

        os << "}";
      }
      os << "]}";
    }
  }

  os << "]}\n";
}